

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImBoolVector::SetBit(ImBoolVector *this,int n,bool v)

{
  uint uVar1;
  uint *puVar2;
  int mask;
  int off;
  bool v_local;
  int n_local;
  ImBoolVector *this_local;
  
  uVar1 = 1 << ((byte)n & 0x1f);
  if (v) {
    puVar2 = (uint *)ImVector<int>::operator[]((ImVector<int> *)this,n >> 5);
    *puVar2 = uVar1 | *puVar2;
  }
  else {
    puVar2 = (uint *)ImVector<int>::operator[]((ImVector<int> *)this,n >> 5);
    *puVar2 = (uVar1 ^ 0xffffffff) & *puVar2;
  }
  return;
}

Assistant:

void            SetBit(int n, bool v)   { int off = (n >> 5); int mask = 1 << (n & 31); if (v) Storage[off] |= mask; else Storage[off] &= ~mask; }